

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::fpToString<double>(string *__return_storage_ptr__,double value,int precision)

{
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar1;
  size_t sVar2;
  long lVar3;
  ReusableStringStream rss;
  ReusableStringStream local_50;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (NAN(value)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"nan","");
  }
  else {
    local_50.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001ccec8
    ;
    pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    sVar2 = StringStreams::add(&pSVar1->super_StringStreams);
    local_50.m_index = sVar2;
    pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    local_50.m_oss =
         *(ostream **)
          &(pSVar1->super_StringStreams).m_streams.
           super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar2]._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    lVar3 = *(long *)local_50.m_oss;
    *(long *)((long)local_50.m_oss + *(long *)(lVar3 + -0x18) + 8) = (long)precision;
    lVar3 = *(long *)(lVar3 + -0x18);
    *(uint *)((long)local_50.m_oss + lVar3 + 0x18) =
         *(uint *)((long)local_50.m_oss + lVar3 + 0x18) & 0xfffffefb | 4;
    std::ostream::_M_insert<double>(value);
    std::__cxx11::stringbuf::str();
    lVar3 = std::__cxx11::string::find_last_not_of((char)__return_storage_ptr__,0x30);
    if ((lVar3 != -1) && (lVar3 != __return_storage_ptr__->_M_string_length - 1)) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0]);
      }
    }
    ReusableStringStream::~ReusableStringStream(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fpToString( T value, int precision ) {
    if (Catch::isnan(value)) {
        return "nan";
    }

    ReusableStringStream rss;
    rss << std::setprecision( precision )
        << std::fixed
        << value;
    std::string d = rss.str();
    std::size_t i = d.find_last_not_of( '0' );
    if( i != std::string::npos && i != d.size()-1 ) {
        if( d[i] == '.' )
            i++;
        d = d.substr( 0, i+1 );
    }
    return d;
}